

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinimizeRecGroups.cpp
# Opt level: O3

void __thiscall wasm::anon_unknown_0::MinimizeRecGroups::run(MinimizeRecGroups *this,Module *module)

{
  __node_base_ptr this_00;
  size_t *psVar1;
  DisjointSets *this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_02;
  pointer *ppRVar2;
  RecGroupInfo *__args;
  iterator __position;
  pointer pRVar3;
  pointer pRVar4;
  pointer __first;
  pointer puVar5;
  pointer puVar6;
  pointer pFVar7;
  void *pvVar8;
  undefined1 auVar9 [8];
  uint uVar10;
  Shareability share;
  HeapTypeKind HVar11;
  pointer __result;
  size_t sVar12;
  pointer pRVar13;
  pointer pRVar14;
  _Storage<wasm::HeapType,_true> _Var15;
  size_t sVar16;
  uint *puVar17;
  iterator iVar18;
  Type TVar19;
  Type TVar20;
  Struct *pSVar21;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *__x;
  mapped_type *pmVar22;
  pointer pHVar23;
  _Tp_alloc_type *p_Var24;
  pointer pHVar25;
  pointer pFVar26;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *extraout_RDX;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *extraout_RDX_00;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *extraout_RDX_01;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *extraout_RDX_02;
  uint uVar27;
  GroupClassInfo *classInfo;
  _Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
  *this_03;
  _Storage<wasm::HeapType,_true> _Var28;
  optional<wasm::(anonymous_namespace)::GroupClassInfo> *poVar29;
  iterator iVar30;
  ulong uVar31;
  int iVar32;
  uint uVar33;
  _Hash_node_base *p_Var34;
  long *plVar35;
  long lVar36;
  __hashtable *__h_1;
  ulong uVar37;
  __node_base_ptr p_Var38;
  __hashtable *__h;
  RecGroupInfo *__args_00;
  bool bVar39;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::RecGroupShape,_unsigned_int>,_false,_true>,_bool>
  pVar40;
  optional<wasm::HeapType> oVar41;
  Signature SVar42;
  optional<wasm::HeapType> desc;
  optional<wasm::HeapType> desc_00;
  undefined1 local_310 [8];
  InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> typeInfo;
  unordered_set<wasm::RecGroup,_std::hash<wasm::RecGroup>,_std::equal_to<wasm::RecGroup>,_std::allocator<wasm::RecGroup>_>
  publicGroups;
  _Storage<wasm::HeapType,_true> _Stack_278;
  vector<wasm::Field,_std::allocator<wasm::Field>_> fields;
  undefined8 auStack_208 [2];
  undefined1 local_1f8;
  undefined1 local_1e8;
  _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1e0;
  undefined1 auStack_1a8 [8];
  RecGroup group;
  __node_base local_198;
  pointer puStack_190;
  float local_188;
  undefined4 uStack_184;
  __node_base_ptr p_Stack_178;
  pointer local_170;
  pointer local_160;
  pointer local_150;
  pointer local_140;
  _Storage<wasm::HeapType,_true> _Stack_138;
  unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
  outputIndices;
  long local_f0;
  void *local_e0;
  long local_d0;
  undefined1 local_c8 [8];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  deps;
  vector<unsigned_int,_std::allocator<unsigned_int>_> permutation;
  Index index;
  undefined1 auStack_88 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> sccTypes;
  _Storage<wasm::HeapType,_true> local_50;
  Iterator __begin2;
  Index other;
  __hashtable *__h_2;
  
  if (((module->features).features & 0x400) != 0) {
    if (wasm::(anonymous_namespace)::MinimizeRecGroups::initBrandOptions()::fieldsInitialized ==
        '\0') {
      _GLOBAL__N_1::MinimizeRecGroups::run();
    }
    p_Var24 = (_Tp_alloc_type *)0x1;
    wasm::ModuleUtils::collectHeapTypeInfo
              ((InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> *)local_310,module
               ,AllTypes,FindVisibility);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::reserve
              (&this->types,(size_type)typeInfo.Map._M_h._M_before_begin._M_nxt);
    typeInfo.List.
    super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
    ._M_impl._M_node._M_size = (size_t)&publicGroups._M_h._M_rehash_policy._M_next_resize;
    publicGroups._M_h._M_buckets = (__buckets_ptr)0x1;
    publicGroups._M_h._M_bucket_count = 0;
    publicGroups._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    publicGroups._M_h._M_element_count._0_4_ = 0x3f800000;
    publicGroups._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    publicGroups._M_h._M_rehash_policy._4_4_ = 0;
    publicGroups._M_h._M_rehash_policy._M_next_resize = 0;
    if (typeInfo.Map._M_h._M_single_bucket != (__node_base_ptr)&typeInfo.Map._M_h._M_single_bucket)
    {
      psVar1 = &typeInfo.List.
                super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                ._M_impl._M_node._M_size;
      p_Var34 = typeInfo.Map._M_h._M_single_bucket;
      do {
        this_00 = p_Var34 + 2;
        if (*(int *)((long)&p_Var34[3]._M_nxt + 4) == 2) {
          __position._M_current =
               (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
            _M_realloc_insert<wasm::HeapType_const&>
                      ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)&this->types,
                       __position,(HeapType *)this_00);
            _Stack_278 = (_Storage<wasm::HeapType,_true>)this_00->_M_nxt;
          }
          else {
            _Stack_278 = (_Storage<wasm::HeapType,_true>)this_00->_M_nxt;
            (__position._M_current)->id = (uintptr_t)_Stack_278;
            (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
            _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          uVar33 = (uint)(this->typeIndices)._M_h._M_element_count;
          p_Var24 = (_Tp_alloc_type *)(ulong)uVar33;
          fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(fields.
                                 super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,uVar33);
          std::
          _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<wasm::HeapType_const,unsigned_int>>
                    ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&this->typeIndices,&_Stack_278);
        }
        else {
          _Stack_138._M_value.id = (HeapType)HeapType::getRecGroup((HeapType *)this_00);
          _Stack_278 = (_Storage<wasm::HeapType,_true>)psVar1;
          std::
          _Hashtable<wasm::RecGroup,wasm::RecGroup,std::allocator<wasm::RecGroup>,std::__detail::_Identity,std::equal_to<wasm::RecGroup>,std::hash<wasm::RecGroup>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<wasm::RecGroup,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::RecGroup,true>>>>
                    ((_Hashtable<wasm::RecGroup,wasm::RecGroup,std::allocator<wasm::RecGroup>,std::__detail::_Identity,std::equal_to<wasm::RecGroup>,std::hash<wasm::RecGroup>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)psVar1,&_Stack_138,&_Stack_278);
        }
        p_Var34 = p_Var34->_M_nxt;
      } while (p_Var34 != (_Hash_node_base *)&typeInfo.Map._M_h._M_single_bucket);
    }
    std::
    vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
    ::reserve(&this->publicGroupTypes,(size_type)publicGroups._M_h._M_before_begin._M_nxt);
    if (publicGroups._M_h._M_bucket_count != 0) {
      plVar35 = (long *)publicGroups._M_h._M_bucket_count;
      do {
        auStack_1a8 = (undefined1  [8])plVar35[1];
        fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        _Stack_278 = (_Storage<wasm::HeapType,_true>)auStack_1a8;
        outputIndices._M_h._M_buckets = (__buckets_ptr)RecGroup::size((RecGroup *)auStack_1a8);
        _Stack_138 = (_Storage<wasm::HeapType,_true>)auStack_1a8;
        std::
        vector<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::allocator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
        ::emplace_back<wasm::RecGroup::Iterator,wasm::RecGroup::Iterator>
                  ((vector<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::allocator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
                    *)&this->publicGroupTypes,(Iterator *)&_Stack_278._M_value,
                   (Iterator *)&_Stack_138._M_value);
        _Stack_278 = (_Storage<wasm::HeapType,_true>)
                     ((this->publicGroupTypes).
                      super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + -1);
        fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
        pVar40 = std::
                 _Hashtable<wasm::RecGroupShape,std::pair<wasm::RecGroupShape_const,unsigned_int>,std::allocator<std::pair<wasm::RecGroupShape_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::RecGroupShape>,std::hash<wasm::RecGroupShape>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                 ::_M_emplace<std::pair<wasm::RecGroupShape_const,unsigned_int>>
                           ((_Hashtable<wasm::RecGroupShape,std::pair<wasm::RecGroupShape_const,unsigned_int>,std::allocator<std::pair<wasm::RecGroupShape_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::RecGroupShape>,std::hash<wasm::RecGroupShape>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                             *)&this->groupShapeIndices,&_Stack_278);
        if (((undefined1  [16])pVar40 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          __assert_fail("inserted",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                        ,0x196,
                        "virtual void wasm::(anonymous namespace)::MinimizeRecGroups::run(Module *)"
                       );
        }
        plVar35 = (long *)*plVar35;
      } while (plVar35 != (long *)0x0);
    }
    _Var28 = (_Storage<wasm::HeapType,_true>)
             (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pFVar26 = (pointer)(this->types).
                       super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                       super__Vector_impl_data._M_finish;
    this_03 = (_Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
               *)((long)pFVar26 - (long)_Var28 >> 3);
    if ((ulong)this_03 >> 0x37 != 0) {
      std::__throw_length_error("vector::reserve");
    }
    pRVar13 = (this->groups).
              super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((_Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
         *)((long)(this->groups).
                  super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pRVar13 >> 8) < this_03
       ) {
      pRVar3 = (this->groups).
               super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      __result = std::
                 _Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                 ::_M_allocate(this_03,(size_t)_Var28);
      std::
      vector<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
      ::_S_relocate((this->groups).
                    super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (this->groups).
                    super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish,__result,p_Var24);
      pRVar4 = (this->groups).
               super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pRVar4 != (pointer)0x0) {
        operator_delete(pRVar4,(long)(this->groups).
                                     super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pRVar4);
      }
      (this->groups).
      super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = __result;
      (this->groups).
      super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)(((long)pRVar3 - (long)pRVar13) + (long)__result);
      (this->groups).
      super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)this_03;
      _Var28 = (_Storage<wasm::HeapType,_true>)
               (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pFVar26 = (pointer)(this->types).
                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                         .super__Vector_impl_data._M_finish;
    }
    fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    auStack_208[0] = 0;
    local_1f8 = 0;
    local_1e8 = 0;
    _Stack_278 = _Var28;
    fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
    super__Vector_impl_data._M_start = pFVar26;
    std::
    _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _Hashtable<__gnu_cxx::__normal_iterator<wasm::HeapType_const*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
              ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&local_1e0,_Var28,pFVar26,0,&_Stack_138,auStack_1a8,auStack_88);
    _Stack_138 = (_Storage<wasm::HeapType,_true>)&_Stack_278;
    SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
    ::Iterator::operator++((Iterator *)&_Stack_138._M_value);
    local_50 = _Stack_138;
    this_01 = &this->equivalenceClasses;
    this_02 = &this->shapesToUpdate;
    while (_Var15 = local_50, local_50 != (_Storage<wasm::HeapType,_true>)0x0) {
      sVar12 = DisjointSets::addSet(this_01);
      permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = (uint)sVar12;
      uVar31 = sVar12 & 0xffffffff;
      __first = (this->groups).
                super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pRVar14 = (this->groups).
                super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      lVar36 = (long)pRVar14 - (long)__first;
      if (uVar31 != lVar36 >> 8) {
        __assert_fail("index == groups.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                      ,0x1a1,
                      "virtual void wasm::(anonymous namespace)::MinimizeRecGroups::run(Module *)");
      }
      if (pRVar14 ==
          (this->groups).
          super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        if (lVar36 == 0x7fffffffffffff00) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        p_Var24 = (_Tp_alloc_type *)0x1;
        uVar37 = uVar31;
        if (pRVar14 == __first) {
          uVar37 = 1;
        }
        pRVar13 = std::
                  _Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                  ::_M_allocate((_Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                                 *)(uVar37 + uVar31),(size_t)_Var28);
        memset((void *)(lVar36 + (long)pRVar13),0,0x100);
        pRVar14 = std::
                  vector<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                  ::_S_relocate(__first,pRVar14,pRVar13,p_Var24);
        types = extraout_RDX_00;
        if (__first != (pointer)0x0) {
          operator_delete(__first,(long)(this->groups).
                                        super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)__first);
          types = extraout_RDX_01;
        }
        (this->groups).
        super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
        ._M_impl.super__Vector_impl_data._M_start = pRVar13;
        (this->groups).
        super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish = pRVar14 + 1;
        (this->groups).
        super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pRVar13 + (long)(uVar37 + uVar31);
      }
      else {
        memset(pRVar14,0,0x100);
        ppRVar2 = &(this->groups).
                   super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppRVar2 = *ppRVar2 + 1;
        types = extraout_RDX;
      }
      bVar39 = *(char *)((long)_Var15 + 0x90) == '\x01';
      p_Var38 = publicGroups._M_h._M_single_bucket;
      if (bVar39) {
        p_Var38 = *(__node_base_ptr *)
                   ((long)*(_Storage<wasm::HeapType,_true> *)((long)_Var15 + 0x30) + -8);
      }
      auStack_88 = (undefined1  [8])0x0;
      sccTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      sccTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      _Stack_138 = _Var15;
      outputIndices._M_h._M_bucket_count = CONCAT71(outputIndices._M_h._M_bucket_count._1_7_,bVar39)
      ;
      outputIndices._M_h._M_buckets = &p_Var38->_M_nxt;
      do {
        if (*(char *)((long)_Stack_138 + 0x90) != '\x01') break;
        auStack_1a8 = (undefined1  [8])outputIndices._M_h._M_buckets;
        if (sccTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_start ==
            sccTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::
          _M_realloc_insert<wasm::HeapType>
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_88,
                     (iterator)
                     sccTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                     _M_impl.super__Vector_impl_data._M_start,(HeapType *)auStack_1a8);
        }
        else {
          (sccTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_start)->id = (uintptr_t)outputIndices._M_h._M_buckets;
          sccTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_start =
               sccTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
        ::SCC::Iterator::operator++((Iterator *)&_Stack_138._M_value);
        types = extraout_RDX_02;
      } while (_Stack_138 != (_Storage<wasm::HeapType,_true>)0x0);
      createSubtypeGraph((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          *)local_c8,(anon_unknown_0 *)auStack_88,types);
      TopologicalOrdersImpl<std::monostate>::TopologicalOrdersImpl
                ((TopologicalOrdersImpl<std::monostate> *)auStack_1a8,
                 (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)local_c8);
      TopologicalOrdersImpl<std::monostate>::TopologicalOrdersImpl
                ((TopologicalOrdersImpl<std::monostate> *)&_Stack_138,auStack_1a8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &deps.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &outputIndices._M_h._M_element_count);
      if (local_e0 != (void *)0x0) {
        operator_delete(local_e0,local_d0 - (long)local_e0);
      }
      if (outputIndices._M_h._M_single_bucket != (__node_base_ptr)0x0) {
        operator_delete(outputIndices._M_h._M_single_bucket,
                        local_f0 - (long)outputIndices._M_h._M_single_bucket);
      }
      pvVar8 = (void *)CONCAT44(outputIndices._M_h._M_element_count._4_4_,
                                (undefined4)outputIndices._M_h._M_element_count);
      if (pvVar8 != (void *)0x0) {
        operator_delete(pvVar8,outputIndices._M_h._M_rehash_policy._M_next_resize - (long)pvVar8);
      }
      if (outputIndices._M_h._M_buckets != (__buckets_ptr)0x0) {
        operator_delete(outputIndices._M_h._M_buckets,
                        (long)outputIndices._M_h._M_before_begin._M_nxt -
                        (long)outputIndices._M_h._M_buckets);
      }
      if (local_150 != (pointer)0x0) {
        operator_delete(local_150,(long)local_140 - (long)local_150);
      }
      if (local_170 != (pointer)0x0) {
        operator_delete(local_170,(long)local_160 - (long)local_170);
      }
      pvVar8 = (void *)CONCAT44(uStack_184,local_188);
      if (pvVar8 != (void *)0x0) {
        operator_delete(pvVar8,(long)p_Stack_178 - (long)pvVar8);
      }
      if (group.id != 0) {
        operator_delete((void *)group.id,(long)puStack_190 - group.id);
      }
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::resize
                (&(this->groups).
                  super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].group,
                 (long)sccTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                       _M_impl.super__Vector_impl_data._M_start - (long)auStack_88 >> 3);
      if ((long)sccTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                .super__Vector_impl_data._M_start - (long)auStack_88 != 0) {
        pHVar23 = (this->groups).
                  super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].group.
                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar31 = 0;
        do {
          *(_Storage<wasm::HeapType,_true> *)(pHVar23 + uVar31) =
               *(_Storage<wasm::HeapType,_true> *)
                ((long)auStack_88 +
                (ulong)*(uint *)((long)&((deps.
                                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar31 * 4) * 8
                );
          uVar31 = uVar31 + 1;
        } while ((uVar31 & 0xffffffff) <
                 (ulong)((long)sccTypes.
                               super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                               _M_impl.super__Vector_impl_data._M_start - (long)auStack_88 >> 3));
      }
      _Var15 = (_Storage<wasm::HeapType,_true>)
               (this->shapesToUpdate).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      _Var28 = (_Storage<wasm::HeapType,_true>)
               (this->shapesToUpdate).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (_Var15 != _Var28) {
        __assert_fail("shapesToUpdate.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                      ,0x1ad,
                      "virtual void wasm::(anonymous namespace)::MinimizeRecGroups::run(Module *)");
      }
      publicGroups._M_h._M_single_bucket = p_Var38;
      if (_Var15 == (_Storage<wasm::HeapType,_true>)
                    (this->shapesToUpdate).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_02,
                   (iterator)_Var28._M_value.id,
                   (uint *)((long)&permutation.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        _Var15 = (_Storage<wasm::HeapType,_true>)
                 (this->shapesToUpdate).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        _Var28 = (_Storage<wasm::HeapType,_true>)
                 (this->shapesToUpdate).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      else {
        *(uint *)_Var28 =
             permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_;
        _Var28 = (_Storage<wasm::HeapType,_true>)((long)_Var28 + 4);
        (this->shapesToUpdate).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)_Var28;
      }
      if (_Var15 != _Var28) {
        do {
          uVar33 = *(uint *)((long)_Var28 - 4);
          uVar31 = (ulong)uVar33;
          (this->shapesToUpdate).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = (uint *)((long)_Var28 - 4);
          auStack_1a8._0_4_ = uVar33;
          _Stack_138 = (_Storage<wasm::HeapType,_true>)
                       ((this->groups).
                        super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar31);
          outputIndices._M_h._M_buckets =
               (__buckets_ptr)CONCAT44(outputIndices._M_h._M_buckets._4_4_,uVar33);
          pVar40 = std::
                   _Hashtable<wasm::RecGroupShape,std::pair<wasm::RecGroupShape_const,unsigned_int>,std::allocator<std::pair<wasm::RecGroupShape_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::RecGroupShape>,std::hash<wasm::RecGroupShape>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                   ::_M_emplace<std::pair<wasm::RecGroupShape_const,unsigned_int>>
                             ((_Hashtable<wasm::RecGroupShape,std::pair<wasm::RecGroupShape_const,unsigned_int>,std::allocator<std::pair<wasm::RecGroupShape_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::RecGroupShape>,std::hash<wasm::RecGroupShape>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                               *)&this->groupShapeIndices,&_Stack_138);
          if (((undefined1  [16])pVar40 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            __args_00 = (this->groups).
                        super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar31;
            sVar12 = DisjointSets::getRoot(this_01,uVar31);
            uVar33 = *(uint *)((long)pVar40.first.
                                     super__Node_iterator_base<std::pair<const_wasm::RecGroupShape,_unsigned_int>,_true>
                                     ._M_cur + 0x10);
            uVar31 = (ulong)uVar33;
            pRVar13 = (this->groups).
                      super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar27 = (uint)sVar12;
            __begin2.scc.parent._0_4_ = uVar33;
            if (uVar31 == 0xffffffff) {
              if (pRVar13[sVar12 & 0xffffffff].classInfo.
                  super__Optional_base<wasm::(anonymous_namespace)::GroupClassInfo,_false,_false>.
                  _M_payload.
                  super__Optional_payload<wasm::(anonymous_namespace)::GroupClassInfo,_true,_false,_false>
                  .super__Optional_payload_base<wasm::(anonymous_namespace)::GroupClassInfo>.
                  _M_engaged == true) {
                GroupClassInfo::advance((GroupClassInfo *)&pRVar13[sVar12 & 0xffffffff].classInfo);
                GroupClassInfo::permute
                          ((GroupClassInfo *)&pRVar13[sVar12 & 0xffffffff].classInfo,__args_00);
              }
              else {
                if (auStack_1a8._0_4_ != uVar27) {
                  __assert_fail("group == groupRep",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                                ,0x208,
                                "void wasm::(anonymous namespace)::MinimizeRecGroups::updateShape(Index)"
                               );
                }
                getCanonicalPermutation
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &_Stack_138._M_value,this,&__args_00->group);
                puVar5 = (__args_00->permutation).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                puVar6 = (__args_00->permutation).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
                (__args_00->permutation).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)_Stack_138;
                (__args_00->permutation).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)outputIndices._M_h._M_buckets;
                (__args_00->permutation).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     (pointer)outputIndices._M_h._M_bucket_count;
                _Stack_138 = (_Storage<wasm::HeapType,_true>)0x0;
                outputIndices._M_h._M_buckets = (__buckets_ptr)0x0;
                outputIndices._M_h._M_bucket_count = 0;
                if ((puVar5 != (pointer)0x0) &&
                   (operator_delete(puVar5,(long)puVar6 - (long)puVar5),
                   _Stack_138 != (_Storage<wasm::HeapType,_true>)0x0)) {
                  operator_delete((void *)_Stack_138,
                                  outputIndices._M_h._M_bucket_count - (long)_Stack_138);
                }
                std::optional<wasm::(anonymous_namespace)::GroupClassInfo>::
                emplace<wasm::(anonymous_namespace)::RecGroupInfo&>(&__args_00->classInfo,__args_00)
                ;
                GroupClassInfo::permute((GroupClassInfo *)&__args_00->classInfo,__args_00);
              }
            }
            else {
              sVar16 = DisjointSets::getRoot(this_01,uVar31);
              uVar37 = sVar12 & 0xffffffff;
              pRVar3 = (this->groups).
                       super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              poVar29 = &pRVar3[uVar37].classInfo;
              bVar39 = pRVar3[uVar37].classInfo.
                       super__Optional_base<wasm::(anonymous_namespace)::GroupClassInfo,_false,_false>
                       ._M_payload.
                       super__Optional_payload<wasm::(anonymous_namespace)::GroupClassInfo,_true,_false,_false>
                       .super__Optional_payload_base<wasm::(anonymous_namespace)::GroupClassInfo>.
                       _M_engaged;
              uVar10 = (uint)sVar16;
              if (uVar27 == uVar10) {
                if (bVar39 == false) {
                  __assert_fail("groups[groupRep].classInfo",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                                ,0x218,
                                "void wasm::(anonymous namespace)::MinimizeRecGroups::updateShape(Index)"
                               );
                }
                GroupClassInfo::advanceBrand((GroupClassInfo *)poVar29);
                GroupClassInfo::permute((GroupClassInfo *)poVar29,__args_00);
              }
              else {
                __args = pRVar13 + uVar31;
                uVar31 = sVar16 & 0xffffffff;
                if (bVar39 == false) {
                  if (pRVar3[uVar31].classInfo.
                      super__Optional_base<wasm::(anonymous_namespace)::GroupClassInfo,_false,_false>
                      ._M_payload.
                      super__Optional_payload<wasm::(anonymous_namespace)::GroupClassInfo,_true,_false,_false>
                      .super__Optional_payload_base<wasm::(anonymous_namespace)::GroupClassInfo>.
                      _M_engaged != true) {
                    if ((uVar33 != uVar10) || (auStack_1a8._0_4_ != uVar27)) {
                      __assert_fail("group == groupRep && other == otherRep",
                                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                                    ,0x265,
                                    "void wasm::(anonymous namespace)::MinimizeRecGroups::updateShape(Index)"
                                   );
                    }
                    std::
                    _Hashtable<wasm::RecGroupShape,_std::pair<const_wasm::RecGroupShape,_unsigned_int>,_std::allocator<std::pair<const_wasm::RecGroupShape,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::RecGroupShape>,_std::hash<wasm::RecGroupShape>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::erase(&(this->groupShapeIndices)._M_h,
                            (_Node_iterator_base<std::pair<const_wasm::RecGroupShape,_unsigned_int>,_true>
                             )pVar40.first.
                              super__Node_iterator_base<std::pair<const_wasm::RecGroupShape,_unsigned_int>,_true>
                              ._M_cur);
                    getCanonicalPermutation
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &_Stack_138._M_value,this,&__args_00->group);
                    puVar5 = (__args->permutation).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start;
                    puVar6 = (__args->permutation).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage;
                    (__args->permutation).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)_Stack_138;
                    (__args->permutation).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)outputIndices._M_h._M_buckets;
                    (__args->permutation).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage =
                         (pointer)outputIndices._M_h._M_bucket_count;
                    _Stack_138 = (_Storage<wasm::HeapType,_true>)0x0;
                    outputIndices._M_h._M_buckets = (__buckets_ptr)0x0;
                    outputIndices._M_h._M_bucket_count = 0;
                    if (puVar5 != (pointer)0x0) {
                      operator_delete(puVar5,(long)puVar6 - (long)puVar5);
                    }
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                              (&__args_00->permutation,&__args->permutation);
                    poVar29 = &__args->classInfo;
                    std::optional<wasm::(anonymous_namespace)::GroupClassInfo>::
                    emplace<wasm::(anonymous_namespace)::RecGroupInfo&>(poVar29,__args);
                    GroupClassInfo::permute((GroupClassInfo *)poVar29,__args);
                    GroupClassInfo::permute((GroupClassInfo *)poVar29,__args_00);
                    iVar30._M_current =
                         (this->shapesToUpdate).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    puVar17 = (this->shapesToUpdate).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage;
                    if (iVar30._M_current == puVar17) {
                      std::vector<unsigned_int,std::allocator<unsigned_int>>::
                      _M_realloc_insert<unsigned_int_const&>
                                ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_02,iVar30
                                 ,(uint *)auStack_1a8);
                      iVar30._M_current =
                           (this->shapesToUpdate).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                      puVar17 = (this->shapesToUpdate).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage;
                    }
                    else {
                      *iVar30._M_current = auStack_1a8._0_4_;
                      iVar30._M_current = iVar30._M_current + 1;
                      (this->shapesToUpdate).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish = iVar30._M_current;
                    }
                    if (iVar30._M_current == puVar17) {
                      std::vector<unsigned_int,std::allocator<unsigned_int>>::
                      _M_realloc_insert<unsigned_int_const&>
                                ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_02,iVar30
                                 ,(uint *)&__begin2);
                    }
                    else {
                      *iVar30._M_current = (uint)__begin2.scc.parent;
                      (this->shapesToUpdate).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish = iVar30._M_current + 1;
                    }
                    if (_Stack_138 != (_Storage<wasm::HeapType,_true>)0x0) {
                      operator_delete((void *)_Stack_138,
                                      outputIndices._M_h._M_bucket_count - (long)_Stack_138);
                    }
                    goto LAB_0097a8ba;
                  }
                  sVar12 = DisjointSets::getUnion(this_01,uVar31,uVar37);
                  if (uVar10 != (uint)sVar12) {
                    __assert_fail("otherRep == unionRep",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                                  ,0x254,
                                  "void wasm::(anonymous namespace)::MinimizeRecGroups::updateShape(Index)"
                                 );
                  }
                  std::_Optional_payload_base<wasm::(anonymous_namespace)::GroupClassInfo>::_M_reset
                            ((_Optional_payload_base<wasm::(anonymous_namespace)::GroupClassInfo> *)
                             &__args_00->classInfo);
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                            (&__args_00->permutation,&__args->permutation);
                  GroupClassInfo::advance((GroupClassInfo *)&pRVar3[uVar31].classInfo);
                  GroupClassInfo::permute((GroupClassInfo *)&pRVar3[uVar31].classInfo,__args_00);
                }
                else if (pRVar3[uVar31].classInfo.
                         super__Optional_base<wasm::(anonymous_namespace)::GroupClassInfo,_false,_false>
                         ._M_payload.
                         super__Optional_payload<wasm::(anonymous_namespace)::GroupClassInfo,_true,_false,_false>
                         .super__Optional_payload_base<wasm::(anonymous_namespace)::GroupClassInfo>.
                         _M_engaged == true) {
                  GroupClassInfo::advance((GroupClassInfo *)poVar29);
                  GroupClassInfo::permute((GroupClassInfo *)poVar29,__args_00);
                }
                else {
                  sVar12 = DisjointSets::getUnion(this_01,uVar37,uVar31);
                  if (uVar27 != (uint)sVar12) {
                    __assert_fail("groupRep == unionRep",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                                  ,0x23f,
                                  "void wasm::(anonymous namespace)::MinimizeRecGroups::updateShape(Index)"
                                 );
                  }
                  std::_Optional_payload_base<wasm::(anonymous_namespace)::GroupClassInfo>::_M_reset
                            ((_Optional_payload_base<wasm::(anonymous_namespace)::GroupClassInfo> *)
                             &__args->classInfo);
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                            (&__args->permutation,&__args_00->permutation);
                  GroupClassInfo::advance((GroupClassInfo *)poVar29);
                  GroupClassInfo::permute((GroupClassInfo *)poVar29,__args_00);
                }
              }
            }
            iVar30._M_current =
                 (this->shapesToUpdate).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar30._M_current ==
                (this->shapesToUpdate).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_02,iVar30,
                         (uint *)auStack_1a8);
            }
            else {
              *iVar30._M_current = auStack_1a8._0_4_;
              (this->shapesToUpdate).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
              ._M_impl.super__Vector_impl_data._M_finish = iVar30._M_current + 1;
            }
          }
LAB_0097a8ba:
          _Var28 = (_Storage<wasm::HeapType,_true>)
                   (this->shapesToUpdate).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        } while ((_Storage<wasm::HeapType,_true>)
                 (this->shapesToUpdate).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start != _Var28);
      }
      if (deps.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        _Var28 = (_Storage<wasm::HeapType,_true>)
                 ((long)permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)deps.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        operator_delete(deps.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)_Var28);
      }
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)local_c8);
      if (auStack_88 != (undefined1  [8])0x0) {
        _Var28 = (_Storage<wasm::HeapType,_true>)
                 ((long)sccTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_88);
        operator_delete((void *)auStack_88,(ulong)_Var28);
      }
      SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
      ::Iterator::operator++((Iterator *)&local_50._M_value);
    }
    std::
    _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_1e0);
    memset(auStack_208,0,8);
    if (fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
        super__Vector_impl_data._M_finish != (pointer)0x0) {
      operator_delete(fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                      super__Vector_impl_data._M_finish,
                      -(long)fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                             _M_impl.super__Vector_impl_data._M_finish);
    }
    _Stack_138 = (_Storage<wasm::HeapType,_true>)&outputIndices._M_h._M_rehash_policy._M_next_resize
    ;
    outputIndices._M_h._M_buckets = (__buckets_ptr)0x1;
    outputIndices._M_h._M_bucket_count = 0;
    outputIndices._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    outputIndices._M_h._M_element_count._0_4_ = 0x3f800000;
    outputIndices._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    outputIndices._M_h._M_rehash_policy._4_4_ = 0;
    outputIndices._M_h._M_rehash_policy._M_next_resize = 0;
    pRVar13 = (this->groups).
              super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar3 = (this->groups).
             super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    sVar12 = 0;
    if (pRVar13 != pRVar3) {
      do {
        pHVar23 = (pRVar13->group).
                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pHVar25 = (pRVar13->group).
                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (pHVar25 != pHVar23) {
          uVar33 = 1;
          uVar31 = 0;
          do {
            if ((pRVar13->hasBrand != true) ||
               ((pRVar13->permutation).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar31] != 0)) {
              _Stack_278 = *(_Storage<wasm::HeapType,_true> *)(pHVar23 + uVar31);
              fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(fields.
                                     super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     (int)sVar12 + uVar33 + -1);
              std::
              _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              ::_M_emplace<std::pair<wasm::HeapType_const,unsigned_int>>
                        ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                          *)&_Stack_138,&_Stack_278);
              pHVar23 = (pRVar13->group).
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pHVar25 = (pRVar13->group).
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            }
            uVar31 = (ulong)uVar33;
            uVar33 = uVar33 + 1;
          } while (uVar31 < (ulong)((long)pHVar25 - (long)pHVar23 >> 3));
          sVar12 = (size_t)(((int)sVar12 + uVar33) - 1);
        }
        pRVar13 = pRVar13 + 1;
      } while (pRVar13 != pRVar3);
    }
    TypeBuilder::TypeBuilder((TypeBuilder *)&__begin2,sVar12);
    pRVar13 = (this->groups).
              super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar3 = (this->groups).
             super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar13 != pRVar3) {
      sVar12 = 0;
      do {
        TypeBuilder::createRecGroup
                  ((TypeBuilder *)&__begin2,sVar12,
                   (long)(pRVar13->group).
                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                   (long)(pRVar13->group).
                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                         .super__Vector_impl_data._M_start >> 3);
        pHVar25 = (pRVar13->group).
                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (pHVar23 = (pRVar13->group).
                       super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                       super__Vector_impl_data._M_start; pHVar23 != pHVar25; pHVar23 = pHVar23 + 1)
        {
          local_50 = (_Storage<wasm::HeapType,_true>)pHVar23->id;
          auStack_88 = (undefined1  [8])&_Stack_138;
          sccTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&__begin2;
          if ((ulong)local_50 < 0x7d) {
            __assert_fail("!type.isBasic()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                          ,0x2df,
                          "void wasm::TypeBuilder::copyHeapType(size_t, HeapType, F) [F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp:834:33)]"
                         );
          }
          oVar41 = HeapType::getDeclaredSuperType(&local_50._M_value);
          if (((undefined1  [16])
               oVar41.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
              (undefined1  [16])0x0) {
            _Stack_278 = oVar41.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::HeapType>._M_payload;
            iVar18 = std::
                     _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)auStack_88,&_Stack_278._M_value);
            _Var28 = _Stack_278;
            if (iVar18.
                super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
                _M_cur != (__node_type *)0x0) {
              _Var28._M_value =
                   TypeBuilder::getTempHeapType
                             ((TypeBuilder *)
                              sccTypes.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (ulong)*(uint *)((long)iVar18.
                                                  super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                                  ._M_cur + 0x10));
            }
            oVar41.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
            oVar41.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
                 (HeapType)(HeapType)_Var28;
            TypeBuilder::setSubType((TypeBuilder *)&__begin2,sVar12,oVar41);
          }
          oVar41 = HeapType::getDescriptorType(&local_50._M_value);
          if (((undefined1  [16])
               oVar41.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
              (undefined1  [16])0x0) {
            _Stack_278 = oVar41.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::HeapType>._M_payload;
            iVar18 = std::
                     _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)auStack_88,&_Stack_278._M_value);
            _Var28 = _Stack_278;
            if (iVar18.
                super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
                _M_cur != (__node_type *)0x0) {
              _Var28._M_value =
                   TypeBuilder::getTempHeapType
                             ((TypeBuilder *)
                              sccTypes.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (ulong)*(uint *)((long)iVar18.
                                                  super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                                  ._M_cur + 0x10));
            }
            desc.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
            desc.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
                 (HeapType)(HeapType)_Var28;
            TypeBuilder::setDescriptor((TypeBuilder *)&__begin2,sVar12,desc);
          }
          oVar41 = HeapType::getDescribedType(&local_50._M_value);
          if (((undefined1  [16])
               oVar41.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
              (undefined1  [16])0x0) {
            _Stack_278 = oVar41.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::HeapType>._M_payload;
            iVar18 = std::
                     _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)auStack_88,&_Stack_278._M_value);
            _Var28 = _Stack_278;
            if (iVar18.
                super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
                _M_cur != (__node_type *)0x0) {
              _Var28._M_value =
                   TypeBuilder::getTempHeapType
                             ((TypeBuilder *)
                              sccTypes.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (ulong)*(uint *)((long)iVar18.
                                                  super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                                  ._M_cur + 0x10));
            }
            desc_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
            desc_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
                 (HeapType)(HeapType)_Var28;
            TypeBuilder::setDescribed((TypeBuilder *)&__begin2,sVar12,desc_00);
          }
          bVar39 = HeapType::isOpen(&local_50._M_value);
          TypeBuilder::setOpen((TypeBuilder *)&__begin2,sVar12,bVar39);
          share = HeapType::getShared(&local_50._M_value);
          TypeBuilder::setShared((TypeBuilder *)&__begin2,sVar12,share);
          local_c8 = (undefined1  [8])&__begin2;
          deps.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_88;
          deps.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_c8;
          permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_c8;
          HVar11 = HeapType::getKind(&local_50._M_value);
          switch(HVar11) {
          case Basic:
            handle_unreachable("unexpected kind",
                               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                               ,0x31b);
          case Func:
            SVar42 = HeapType::getSignature(&local_50._M_value);
            TVar19 = TypeBuilder::
                     copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp:834:33)>
                     ::anon_class_16_2_ecc023e0::operator()
                               ((anon_class_16_2_ecc023e0 *)
                                &deps.
                                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,SVar42.params.id
                               );
            TVar20 = TypeBuilder::
                     copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp:834:33)>
                     ::anon_class_16_2_ecc023e0::operator()
                               ((anon_class_16_2_ecc023e0 *)
                                &deps.
                                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                SVar42.results.id);
            SVar42.results.id = TVar20.id;
            SVar42.params.id = TVar19.id;
            TypeBuilder::setHeapType((TypeBuilder *)&__begin2,sVar12,SVar42);
            break;
          case Struct:
            pSVar21 = HeapType::getStruct(&local_50._M_value);
            _Stack_278 = (_Storage<wasm::HeapType,_true>)0x0;
            fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            std::vector<wasm::Field,_std::allocator<wasm::Field>_>::reserve
                      ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&_Stack_278._M_value,
                       (long)(pSVar21->fields).
                             super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(pSVar21->fields).
                             super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                             super__Vector_impl_data._M_start >> 4);
            pFVar7 = (pSVar21->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pFVar26 = (pSVar21->fields).
                           super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                           super__Vector_impl_data._M_start; pFVar26 != pFVar7;
                pFVar26 = pFVar26 + 1) {
              auStack_1a8 = (undefined1  [8])(pFVar26->type).id;
              group.id._0_4_ = pFVar26->packedType;
              group.id._4_4_ = pFVar26->mutable_;
              auStack_1a8 = (undefined1  [8])
                            TypeBuilder::
                            copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp:834:33)>
                            ::anon_class_16_2_ecc023e0::operator()
                                      ((anon_class_16_2_ecc023e0 *)
                                       &deps.
                                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (Type)auStack_1a8);
              if (fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<wasm::Field,std::allocator<wasm::Field>>::
                _M_realloc_insert<wasm::Field_const&>
                          ((vector<wasm::Field,std::allocator<wasm::Field>> *)&_Stack_278._M_value,
                           (iterator)
                           fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                           _M_impl.super__Vector_impl_data._M_start,(Field *)auStack_1a8);
              }
              else {
                ((fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                  super__Vector_impl_data._M_start)->type).id = (uintptr_t)auStack_1a8;
                (fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                 super__Vector_impl_data._M_start)->packedType = (undefined4)group.id;
                (fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                 super__Vector_impl_data._M_start)->mutable_ = group.id._4_4_;
                fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                super__Vector_impl_data._M_start =
                     fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                     super__Vector_impl_data._M_start + 1;
              }
            }
            std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                      ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_1a8,
                       (vector<wasm::Field,_std::allocator<wasm::Field>_> *)&_Stack_278._M_value);
            TypeBuilder::setHeapType((TypeBuilder *)&__begin2,sVar12,(Struct *)auStack_1a8);
            if (auStack_1a8 != (undefined1  [8])0x0) {
              operator_delete((void *)auStack_1a8,(long)local_198._M_nxt - (long)auStack_1a8);
            }
            if (_Stack_278 != (_Storage<wasm::HeapType,_true>)0x0) {
              operator_delete((void *)_Stack_278,
                              (long)fields.
                                    super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)_Stack_278);
            }
            break;
          case Array:
            HeapType::getArray(&_Stack_278._M_value);
            pFVar26 = fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                      super__Vector_impl_data._M_start;
            _Stack_278._M_value.id =
                 (HeapType)
                 TypeBuilder::
                 copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp:834:33)>
                 ::anon_class_16_2_ecc023e0::operator()
                           ((anon_class_16_2_ecc023e0 *)
                            &deps.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (Type)_Stack_278._M_value.id);
            fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
            super__Vector_impl_data._M_start = pFVar26;
            TypeBuilder::setHeapType((TypeBuilder *)&__begin2,sVar12,(Array *)&_Stack_278._M_value);
            break;
          case Cont:
            _Stack_278._M_value.id = (HeapType)HeapType::getContinuation(&local_50._M_value);
            iVar18 = std::
                     _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)auStack_88,&_Stack_278._M_value);
            _Var28 = _Stack_278;
            if (iVar18.
                super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
                _M_cur != (__node_type *)0x0) {
              _Var28._M_value =
                   TypeBuilder::getTempHeapType
                             ((TypeBuilder *)
                              sccTypes.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (ulong)*(uint *)((long)iVar18.
                                                  super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                                  ._M_cur + 0x10));
            }
            TypeBuilder::setHeapType
                      ((TypeBuilder *)&__begin2,sVar12,(Continuation)_Var28._M_value.id);
          }
          sVar12 = (size_t)((int)sVar12 + 1);
        }
        pRVar13 = pRVar13 + 1;
      } while (pRVar13 != pRVar3);
    }
    TypeBuilder::build((BuildResult *)auStack_88,(TypeBuilder *)&__begin2);
    if ((byte)sccTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage != 0) {
      __assert_fail("built",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                    ,0x34b,
                    "void wasm::(anonymous namespace)::MinimizeRecGroups::rewriteTypes(Module &)");
    }
    __x = std::
          get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                    ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      *)auStack_88);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_c8,__x);
    auStack_1a8 = (undefined1  [8])&p_Stack_178;
    group.id = 1;
    p_Stack_178 = (__node_base_ptr)0x0;
    pRVar13 = (this->groups).
              super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar3 = (this->groups).
             super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar13 != pRVar3) {
      iVar32 = 0;
      do {
        pHVar23 = (pRVar13->group).
                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pHVar25 = (pRVar13->group).
                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (pHVar25 != pHVar23) {
          uVar33 = 1;
          uVar31 = 0;
          do {
            auVar9 = local_c8;
            if ((pRVar13->hasBrand != true) ||
               ((pRVar13->permutation).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar31] != 0)) {
              pmVar22 = std::__detail::
                        _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)auStack_1a8,pHVar23 + uVar31);
              pmVar22->id = (uintptr_t)
                            (&(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auVar9)
                              ->_M_impl).super__Vector_impl_data._M_start)[(iVar32 + uVar33) - 1];
              pHVar23 = (pRVar13->group).
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pHVar25 = (pRVar13->group).
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            }
            uVar31 = (ulong)uVar33;
            uVar33 = uVar33 + 1;
          } while (uVar31 < (ulong)((long)pHVar25 - (long)pHVar23 >> 3));
          iVar32 = iVar32 + uVar33 + -1;
        }
        pRVar13 = pRVar13 + 1;
      } while (pRVar13 != pRVar3);
    }
    GlobalTypeRewriter::GlobalTypeRewriter((GlobalTypeRewriter *)&_Stack_278._M_value,module);
    GlobalTypeRewriter::mapTypes((GlobalTypeRewriter *)&_Stack_278._M_value,(TypeMap *)auStack_1a8);
    GlobalTypeRewriter::mapTypeNamesAndIndices
              ((GlobalTypeRewriter *)&_Stack_278._M_value,(TypeMap *)auStack_1a8);
    GlobalTypeRewriter::~GlobalTypeRewriter((GlobalTypeRewriter *)&_Stack_278._M_value);
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)auStack_1a8);
    if (local_c8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_c8,
                      (long)deps.
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)local_c8);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
      ::_S_vtable._M_arr
      [(byte)sccTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage]._M_data)
              ((anon_class_1_0_00000001 *)&_Stack_278._M_value,
               (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                *)auStack_88);
    TypeBuilder::~TypeBuilder((TypeBuilder *)&__begin2);
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&_Stack_138._M_value);
    std::
    _Hashtable<wasm::RecGroup,_wasm::RecGroup,_std::allocator<wasm::RecGroup>,_std::__detail::_Identity,_std::equal_to<wasm::RecGroup>,_std::hash<wasm::RecGroup>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::RecGroup,_wasm::RecGroup,_std::allocator<wasm::RecGroup>,_std::__detail::_Identity,_std::equal_to<wasm::RecGroup>,_std::hash<wasm::RecGroup>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&typeInfo.List.
                      super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                      ._M_impl._M_node._M_size);
    while (typeInfo.Map._M_h._M_single_bucket !=
           (__node_base_ptr)&typeInfo.Map._M_h._M_single_bucket) {
      p_Var34 = (typeInfo.Map._M_h._M_single_bucket)->_M_nxt;
      operator_delete(typeInfo.Map._M_h._M_single_bucket,0x20);
      typeInfo.Map._M_h._M_single_bucket = p_Var34;
    }
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_310);
  }
  return;
}

Assistant:

void run(Module* module) override {
    // There are no recursion groups to minimize if GC is not enabled.
    if (!module->features.hasGC()) {
      return;
    }

    initBrandOptions();

    auto typeInfo = ModuleUtils::collectHeapTypeInfo(
      *module,
      ModuleUtils::TypeInclusion::AllTypes,
      ModuleUtils::VisibilityHandling::FindVisibility);

    types.reserve(typeInfo.size());

    // We cannot optimize public types, but we do need to make sure we don't
    // generate new groups with the same shape.
    std::unordered_set<RecGroup> publicGroups;
    for (auto& [type, info] : typeInfo) {
      if (info.visibility == ModuleUtils::Visibility::Private) {
        // We can optimize private types.
        types.push_back(type);
        typeIndices.insert({type, typeIndices.size()});
      } else {
        publicGroups.insert(type.getRecGroup());
      }
    }

    publicGroupTypes.reserve(publicGroups.size());
    for (auto group : publicGroups) {
      publicGroupTypes.emplace_back(group.begin(), group.end());
      [[maybe_unused]] auto [_, inserted] = groupShapeIndices.insert(
        {RecGroupShape(publicGroupTypes.back()), PublicGroupIndex});
      assert(inserted);
    }

    // The number of types to optimize is an upper bound on the number of
    // recursion groups we will emit.
    groups.reserve(types.size());

    // Compute the strongly connected components and ensure they form distinct
    // recursion groups.
    for (auto scc : TypeSCCs(types)) {
      [[maybe_unused]] Index index = equivalenceClasses.addSet();
      assert(index == groups.size());
      groups.emplace_back();

      // The SCC is not necessarily topologically sorted to have the supertypes
      // come first. Fix that.
      std::vector<HeapType> sccTypes(scc.begin(), scc.end());
      auto deps = createSubtypeGraph(sccTypes);
      auto permutation = *TopologicalOrders(deps).begin();
      groups.back().group.resize(sccTypes.size());
      for (Index i = 0; i < sccTypes.size(); ++i) {
        groups.back().group[i] = sccTypes[permutation[i]];
      }
      assert(shapesToUpdate.empty());
      shapesToUpdate.push_back(index);
      updateShapes();
    }

    rewriteTypes(*module);
  }